

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::image::anon_unknown_2::BinaryAtomicInstanceBase::iterate
          (TestStatus *__return_storage_ptr__,BinaryAtomicInstanceBase *this)

{
  TextureFormat *format;
  UVec3 *imageSize;
  MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *this_00;
  VkImage image;
  VkImageView obj;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  ulong bufferSize;
  MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *pMVar1;
  undefined8 obj_00;
  undefined8 commandBuffer;
  void *pvVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Allocation *pAVar5;
  undefined8 this_01;
  void *pvVar6;
  deUint32 dVar7;
  int iVar8;
  deUint32 dVar9;
  uint uVar10;
  deUint32 dVar11;
  VkImageViewType imageViewType;
  VkFormat format_00;
  VkDevice device;
  DeviceInterface *vk;
  VkQueue queue;
  Allocator *allocator;
  Image *this_02;
  Buffer *this_03;
  const_iterator cVar12;
  int i;
  long lVar13;
  ulong bufferSize_00;
  uint x;
  TestStatus *pTVar14;
  uint y;
  VkExtent3D extent;
  UVec3 gridSize;
  long *local_330;
  long local_328;
  long local_320 [2];
  TestStatus *local_310;
  MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *local_308;
  Allocator *local_300;
  VkImageMemoryBarrier resultImagePreCopyBarrier;
  Buffer inputBuffer;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_270;
  undefined8 local_258;
  undefined8 uStack_250;
  deUint32 local_248;
  undefined8 local_240;
  undefined8 uStack_238;
  deUint32 local_230;
  VkCommandPool local_228;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_220;
  VkPipeline local_208;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_200;
  VkShaderModule local_1e8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_1e0;
  VkImageMemoryBarrier resultImagePostCopyBarrier;
  IVec4 initialValue;
  PixelBufferAccess inputPixelBuffer;
  VkBufferMemoryBarrier outputBufferPreHostReadBarrier;
  VkBufferImageCopy bufferImageCopyParams;
  VkBufferMemoryBarrier inputBufferPostHostWriteBarrier;
  VkImageCreateInfo local_88;
  
  local_310 = __return_storage_ptr__;
  device = Context::getDevice((this->super_TestInstance).m_context);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  queue = Context::getUniversalQueue((this->super_TestInstance).m_context);
  dVar7 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  format = &this->m_format;
  iVar8 = tcu::getPixelSize(this->m_format);
  imageSize = &this->m_imageSize;
  dVar9 = getNumPixels(this->m_imageType,imageSize);
  uVar10 = (*(this->super_TestInstance)._vptr_TestInstance[3])(this);
  local_88.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_88.pNext = (void *)0x0;
  local_88.flags = (uint)(this->m_imageType - IMAGE_TYPE_CUBE < 2) << 4;
  local_88.imageType = mapImageType(this->m_imageType);
  local_88.format = ::vk::mapTextureFormat(format);
  getLayerSize((image *)&resultImagePreCopyBarrier,this->m_imageType,imageSize);
  local_88.extent.width = resultImagePreCopyBarrier.sType;
  local_88.extent.height = resultImagePreCopyBarrier._4_4_;
  local_88.extent.depth = (deUint32)resultImagePreCopyBarrier.pNext;
  local_88.mipLevels = 1;
  local_88.arrayLayers = getNumLayers(this->m_imageType,imageSize);
  local_88.samples = VK_SAMPLE_COUNT_1_BIT;
  local_88.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_88.usage = 0xb;
  local_88.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_88.queueFamilyIndexCount = 0;
  local_88.pQueueFamilyIndices = (deUint32 *)0x0;
  local_88.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  this_02 = (Image *)operator_new(0x30);
  local_300 = allocator;
  Image::Image(this_02,vk,device,allocator,&local_88,(MemoryRequirement)0x0);
  resultImagePreCopyBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  resultImagePreCopyBarrier._4_4_ = 0;
  local_308 = &this->m_resultImage;
  if ((this->m_resultImage).
      super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data.ptr !=
      this_02) {
    de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::reset
              (&local_308->
                super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>);
    (local_308->super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>).m_data.
    ptr = this_02;
  }
  de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::reset
            ((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)
             &resultImagePreCopyBarrier);
  dVar11 = getNumLayers(this->m_imageType,imageSize);
  image.m_internal =
       (((this->m_resultImage).
         super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data.ptr)->
       m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  imageViewType = mapImageViewType(this->m_imageType);
  format_00 = ::vk::mapTextureFormat(format);
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = dVar11;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&resultImagePostCopyBarrier,vk,device,image
                ,imageViewType,format_00,subresourceRange);
  resultImagePreCopyBarrier.srcAccessMask = resultImagePostCopyBarrier.srcAccessMask;
  resultImagePreCopyBarrier.dstAccessMask = resultImagePostCopyBarrier.dstAccessMask;
  resultImagePreCopyBarrier.oldLayout = resultImagePostCopyBarrier.oldLayout;
  resultImagePreCopyBarrier.newLayout = resultImagePostCopyBarrier.newLayout;
  resultImagePreCopyBarrier.sType = resultImagePostCopyBarrier.sType;
  resultImagePreCopyBarrier._4_4_ = resultImagePostCopyBarrier._4_4_;
  resultImagePreCopyBarrier.pNext = resultImagePostCopyBarrier.pNext;
  resultImagePostCopyBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  resultImagePostCopyBarrier._4_4_ = 0;
  resultImagePostCopyBarrier.pNext = (void *)0x0;
  resultImagePostCopyBarrier.srcAccessMask = 0;
  resultImagePostCopyBarrier.dstAccessMask = 0;
  resultImagePostCopyBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  resultImagePostCopyBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  obj.m_internal =
       (this->m_resultImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_resultImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                deleter,obj);
  }
  (this->m_resultImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)resultImagePreCopyBarrier._16_8_;
  (this->m_resultImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)resultImagePreCopyBarrier._24_8_;
  (this->m_resultImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
       = resultImagePreCopyBarrier._0_8_;
  (this->m_resultImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)resultImagePreCopyBarrier.pNext;
  if (resultImagePostCopyBarrier._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)13>_> *)&resultImagePostCopyBarrier.pNext,
               (VkImageView)resultImagePostCopyBarrier._0_8_);
  }
  bufferSize_00 = (ulong)(dVar9 * iVar8);
  bufferSize = (ulong)uVar10;
  makeBufferCreateInfo((VkBufferCreateInfo *)&resultImagePreCopyBarrier,bufferSize_00,1);
  image::Buffer::Buffer
            (&inputBuffer,vk,device,local_300,(VkBufferCreateInfo *)&resultImagePreCopyBarrier,
             (MemoryRequirement)0x1);
  pAVar5 = inputBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  iVar8 = -1;
  if ((ulong)this->m_operation < 7) {
    iVar8 = *(int *)(&DAT_00b37f04 + (ulong)this->m_operation * 4);
  }
  lVar13 = 0;
  do {
    initialValue.m_data[lVar13] = iVar8;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 4);
  getShaderGridSize((image *)&gridSize,this->m_imageType,imageSize);
  tcu::PixelBufferAccess::PixelBufferAccess
            (&inputPixelBuffer,format,gridSize.m_data[0],gridSize.m_data[1],gridSize.m_data[2],
             pAVar5->m_hostPtr);
  if (gridSize.m_data[2] != 0) {
    uVar10 = 0;
    do {
      if (gridSize.m_data[1] != 0) {
        y = 0;
        do {
          if (gridSize.m_data[0] != 0) {
            x = 0;
            do {
              tcu::PixelBufferAccess::setPixel(&inputPixelBuffer,&initialValue,x,y,uVar10);
              x = x + 1;
            } while (x < gridSize.m_data[0]);
          }
          y = y + 1;
        } while (y < gridSize.m_data[1]);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < gridSize.m_data[2]);
  }
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar5->m_memory).m_internal,pAVar5->m_offset,bufferSize_00)
  ;
  this_03 = (Buffer *)operator_new(0x30);
  makeBufferCreateInfo((VkBufferCreateInfo *)&resultImagePreCopyBarrier,bufferSize,2);
  image::Buffer::Buffer
            (this_03,vk,device,local_300,(VkBufferCreateInfo *)&resultImagePreCopyBarrier,
             (MemoryRequirement)0x1);
  resultImagePostCopyBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  resultImagePostCopyBarrier._4_4_ = 0;
  this_00 = &this->m_outputBuffer;
  if ((this->m_outputBuffer).
      super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr !=
      this_03) {
    de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::reset
              (&this_00->
                super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>);
    (this_00->super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>).m_data.
    ptr = this_03;
  }
  de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::reset
            ((UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)
             &resultImagePostCopyBarrier);
  (*(this->super_TestInstance)._vptr_TestInstance[4])(this);
  (*(this->super_TestInstance)._vptr_TestInstance[5])(this);
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)((this->super_TestInstance).m_context)->m_progCollection,&this->m_name);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&resultImagePreCopyBarrier,vk,device,
             *(ProgramBinary **)(cVar12._M_node + 2),0);
  DStack_1e0.m_device = (VkDevice)resultImagePreCopyBarrier._16_8_;
  DStack_1e0.m_allocator = (VkAllocationCallbacks *)resultImagePreCopyBarrier._24_8_;
  local_1e8.m_internal = resultImagePreCopyBarrier._0_8_;
  DStack_1e0.m_deviceIface = (DeviceInterface *)resultImagePreCopyBarrier.pNext;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&resultImagePreCopyBarrier,vk,device,
                     (VkDescriptorSetLayout)
                     (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                     m_data.object.m_internal);
  obj_00 = resultImagePreCopyBarrier._0_8_;
  DStack_270.m_device = (VkDevice)resultImagePreCopyBarrier._16_8_;
  DStack_270.m_allocator = (VkAllocationCallbacks *)resultImagePreCopyBarrier._24_8_;
  DStack_270.m_deviceIface = (DeviceInterface *)resultImagePreCopyBarrier.pNext;
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&resultImagePreCopyBarrier,vk,device,
                      (VkPipelineLayout)resultImagePreCopyBarrier._0_8_,local_1e8);
  DStack_200.m_device = (VkDevice)resultImagePreCopyBarrier._16_8_;
  DStack_200.m_allocator = (VkAllocationCallbacks *)resultImagePreCopyBarrier._24_8_;
  local_208.m_internal = resultImagePreCopyBarrier._0_8_;
  DStack_200.m_deviceIface = (DeviceInterface *)resultImagePreCopyBarrier.pNext;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&resultImagePreCopyBarrier,vk,device,2,dVar7,
             (VkAllocationCallbacks *)0x0);
  DStack_220.m_device = (VkDevice)resultImagePreCopyBarrier._16_8_;
  DStack_220.m_allocator = (VkAllocationCallbacks *)resultImagePreCopyBarrier._24_8_;
  local_228.m_internal = resultImagePreCopyBarrier._0_8_;
  DStack_220.m_deviceIface = (DeviceInterface *)resultImagePreCopyBarrier.pNext;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&resultImagePreCopyBarrier,vk,device,
             (VkCommandPool)resultImagePreCopyBarrier._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  uVar4 = resultImagePreCopyBarrier._24_8_;
  uVar3 = resultImagePreCopyBarrier._16_8_;
  pvVar2 = resultImagePreCopyBarrier.pNext;
  commandBuffer = resultImagePreCopyBarrier._0_8_;
  beginCommandBuffer(vk,(VkCommandBuffer)resultImagePreCopyBarrier._0_8_);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,commandBuffer,1,local_208.m_internal);
  (*vk->_vptr_DeviceInterface[0x56])(vk,commandBuffer,1,obj_00,0,1,&this->m_descriptorSet,0,0);
  makeBufferMemoryBarrier
            (&inputBufferPostHostWriteBarrier,0x4000,0x800,
             (VkBuffer)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize_00);
  local_240 = 1;
  uStack_238 = 1;
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.layerCount = dVar11;
  local_230 = dVar11;
  makeImageMemoryBarrier
            (&resultImagePreCopyBarrier,0,0x1000,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             (VkImage)(((local_308->
                        super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>)
                        .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                      object.m_internal,subresourceRange_00);
  dVar9 = 0;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,commandBuffer,1,0x1000,0,0,0,1,&inputBufferPostHostWriteBarrier,1,
             (int)&resultImagePreCopyBarrier);
  getLayerSize((image *)&resultImagePostCopyBarrier,this->m_imageType,imageSize);
  pvVar6 = resultImagePostCopyBarrier.pNext;
  this_01 = resultImagePostCopyBarrier._0_8_;
  dVar7 = getNumLayers(this->m_imageType,imageSize);
  extent._0_8_ = (ulong)pvVar6 & 0xffffffff;
  extent.depth = dVar7;
  makeBufferImageCopy(&bufferImageCopyParams,(image *)this_01,extent,dVar9);
  pMVar1 = local_308;
  (*vk->_vptr_DeviceInterface[0x62])
            (vk,commandBuffer,
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,
             (((local_308->
               super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>).m_data.
              ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,
             7,1,(int)&bufferImageCopyParams);
  local_258 = 1;
  uStack_250 = 1;
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.layerCount = dVar11;
  local_248 = dVar11;
  makeImageMemoryBarrier
            (&resultImagePostCopyBarrier,0x1000,0x20,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             VK_IMAGE_LAYOUT_GENERAL,
             (VkImage)(((pMVar1->
                        super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>)
                        .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                      object.m_internal,subresourceRange_01);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,commandBuffer,0x1000,0x800,0,0,0,0,0,1,(int)&resultImagePostCopyBarrier);
  (*(this->super_TestInstance)._vptr_TestInstance[6])(this,commandBuffer);
  (*vk->_vptr_DeviceInterface[0x5d])
            (vk,commandBuffer,(ulong)(gridSize.m_data[0] * 5),(ulong)gridSize.m_data[1]);
  (*(this->super_TestInstance)._vptr_TestInstance[7])(this,commandBuffer);
  makeBufferMemoryBarrier
            (&outputBufferPreHostReadBarrier,0x1000,0x2000,
             (VkBuffer)
             (((this_00->
               super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>).m_data
              .ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,commandBuffer,0x1000,0x4000,0,0,0,1,&outputBufferPreHostReadBarrier,0,0);
  endCommandBuffer(vk,(VkCommandBuffer)commandBuffer);
  submitCommandsAndWait(vk,device,queue,(VkCommandBuffer)commandBuffer);
  lVar13 = (long)(((this_00->
                   super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>).
                   m_data.ptr)->m_allocation).
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(lVar13 + 8),*(VkDeviceSize *)(lVar13 + 0x10),
             bufferSize);
  iVar8 = (*(this->super_TestInstance)._vptr_TestInstance[8])(this,lVar13);
  local_330 = local_320;
  if ((char)iVar8 == '\0') {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"Comparison failed","");
    pTVar14 = local_310;
    local_310->m_code = QP_TEST_RESULT_FAIL;
    (local_310->m_description)._M_dataplus._M_p = (pointer)&(local_310->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_310->m_description,local_330,local_328 + (long)local_330);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"Comparison succeeded","");
    pTVar14 = local_310;
    local_310->m_code = QP_TEST_RESULT_PASS;
    (local_310->m_description)._M_dataplus._M_p = (pointer)&(local_310->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_310->m_description,local_330,local_328 + (long)local_330);
  }
  if (local_330 != local_320) {
    operator_delete(local_330,local_320[0] + 1);
  }
  if (commandBuffer != 0) {
    resultImagePreCopyBarrier._0_8_ = commandBuffer;
    (**(code **)(*pvVar2 + 0x240))(pvVar2,uVar3,uVar4,1);
  }
  if (local_228.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_220,local_228);
  }
  if (local_208.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_200,local_208);
  }
  if (obj_00 != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&DStack_270,(VkPipelineLayout)obj_00);
  }
  if (local_1e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_1e0,local_1e8);
  }
  if (inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal !=
      0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (inputBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
      .m_data.ptr != (Allocation *)0x0) {
    (*(inputBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
  }
  return pTVar14;
}

Assistant:

tcu::TestStatus	BinaryAtomicInstanceBase::iterate (void)
{
	const VkDevice			device				= m_context.getDevice();
	const DeviceInterface&	deviceInterface		= m_context.getDeviceInterface();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();
	const VkDeviceSize		imageSizeInBytes	= tcu::getPixelSize(m_format) * getNumPixels(m_imageType, m_imageSize);
	const VkDeviceSize		outBuffSizeInBytes	= getOutputBufferSize();

	const VkImageCreateInfo imageParams	=
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,					// VkStructureType			sType;
		DE_NULL,												// const void*				pNext;
		(m_imageType == IMAGE_TYPE_CUBE ||
		 m_imageType == IMAGE_TYPE_CUBE_ARRAY ?
		 (VkImageCreateFlags)VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT :
		 (VkImageCreateFlags)0u),								// VkImageCreateFlags		flags;
		mapImageType(m_imageType),								// VkImageType				imageType;
		mapTextureFormat(m_format),								// VkFormat					format;
		makeExtent3D(getLayerSize(m_imageType, m_imageSize)),	// VkExtent3D				extent;
		1u,														// deUint32					mipLevels;
		getNumLayers(m_imageType, m_imageSize),					// deUint32					arrayLayers;
		VK_SAMPLE_COUNT_1_BIT,									// VkSampleCountFlagBits	samples;
		VK_IMAGE_TILING_OPTIMAL,								// VkImageTiling			tiling;
		VK_IMAGE_USAGE_STORAGE_BIT |
		VK_IMAGE_USAGE_TRANSFER_SRC_BIT |
		VK_IMAGE_USAGE_TRANSFER_DST_BIT,						// VkImageUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,								// VkSharingMode			sharingMode;
		0u,														// deUint32					queueFamilyIndexCount;
		DE_NULL,												// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,								// VkImageLayout			initialLayout;
	};

	//Create the image that is going to store results of atomic operations
	m_resultImage = de::MovePtr<Image>(new Image(deviceInterface, device, allocator, imageParams, MemoryRequirement::Any));

	const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, getNumLayers(m_imageType, m_imageSize));

	m_resultImageView = makeImageView(deviceInterface, device, m_resultImage->get(), mapImageViewType(m_imageType), mapTextureFormat(m_format), subresourceRange);

	//Prepare the buffer with the initial data for the image
	const Buffer inputBuffer(deviceInterface, device, allocator, makeBufferCreateInfo(imageSizeInBytes, VK_BUFFER_USAGE_TRANSFER_SRC_BIT), MemoryRequirement::HostVisible);

	Allocation& inputBufferAllocation = inputBuffer.getAllocation();

	//Prepare the initial data for the image
	const tcu::IVec4 initialValue(getOperationInitialValue(m_operation));

	tcu::UVec3 gridSize = getShaderGridSize(m_imageType, m_imageSize);
	tcu::PixelBufferAccess inputPixelBuffer(m_format, gridSize.x(), gridSize.y(), gridSize.z(), inputBufferAllocation.getHostPtr());

	for (deUint32 z = 0; z < gridSize.z(); z++)
	for (deUint32 y = 0; y < gridSize.y(); y++)
	for (deUint32 x = 0; x < gridSize.x(); x++)
	{
		inputPixelBuffer.setPixel(initialValue, x, y, z);
	}

	flushMappedMemoryRange(deviceInterface, device, inputBufferAllocation.getMemory(), inputBufferAllocation.getOffset(), imageSizeInBytes);

	// Create a buffer to store shader output copied from result image
	m_outputBuffer = de::MovePtr<Buffer>(new Buffer(deviceInterface, device, allocator, makeBufferCreateInfo(outBuffSizeInBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible));

	prepareResources();

	prepareDescriptors();

	// Create pipeline
	const Unique<VkShaderModule>	shaderModule(createShaderModule(deviceInterface, device, m_context.getBinaryCollection().get(m_name), 0));
	const Unique<VkPipelineLayout>	pipelineLayout(makePipelineLayout(deviceInterface, device, *m_descriptorSetLayout));
	const Unique<VkPipeline>		pipeline(makeComputePipeline(deviceInterface, device, *pipelineLayout, *shaderModule));

	// Create command buffer
	const Unique<VkCommandPool>		cmdPool(createCommandPool(deviceInterface, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer(allocateCommandBuffer(deviceInterface, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	beginCommandBuffer(deviceInterface, *cmdBuffer);

	deviceInterface.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	deviceInterface.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &m_descriptorSet.get(), 0u, DE_NULL);

	const VkBufferMemoryBarrier inputBufferPostHostWriteBarrier	=
		makeBufferMemoryBarrier(VK_ACCESS_HOST_WRITE_BIT,
								VK_ACCESS_TRANSFER_READ_BIT,
								*inputBuffer,
								0ull,
								imageSizeInBytes);

	const VkImageMemoryBarrier	resultImagePreCopyBarrier =
		makeImageMemoryBarrier(	0u,
								VK_ACCESS_TRANSFER_WRITE_BIT,
								VK_IMAGE_LAYOUT_UNDEFINED,
								VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
								m_resultImage->get(),
								subresourceRange);

	deviceInterface.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, DE_FALSE, 0u, DE_NULL, 1u, &inputBufferPostHostWriteBarrier, 1u, &resultImagePreCopyBarrier);

	const VkBufferImageCopy		bufferImageCopyParams = makeBufferImageCopy(makeExtent3D(getLayerSize(m_imageType, m_imageSize)), getNumLayers(m_imageType, m_imageSize));

	deviceInterface.cmdCopyBufferToImage(*cmdBuffer, *inputBuffer, m_resultImage->get(), VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1u, &bufferImageCopyParams);

	const VkImageMemoryBarrier	resultImagePostCopyBarrier	=
		makeImageMemoryBarrier(	VK_ACCESS_TRANSFER_WRITE_BIT,
								VK_ACCESS_SHADER_READ_BIT,
								VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
								VK_IMAGE_LAYOUT_GENERAL,
								m_resultImage->get(),
								subresourceRange);

	deviceInterface.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, DE_FALSE, 0u, DE_NULL, 0u, DE_NULL, 1u, &resultImagePostCopyBarrier);

	commandsBeforeCompute(*cmdBuffer);

	deviceInterface.cmdDispatch(*cmdBuffer, NUM_INVOCATIONS_PER_PIXEL*gridSize.x(), gridSize.y(), gridSize.z());

	commandsAfterCompute(*cmdBuffer);

	const VkBufferMemoryBarrier	outputBufferPreHostReadBarrier
		= makeBufferMemoryBarrier(	VK_ACCESS_TRANSFER_WRITE_BIT,
									VK_ACCESS_HOST_READ_BIT,
									m_outputBuffer->get(),
									0ull,
									outBuffSizeInBytes);

	deviceInterface.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, DE_FALSE, 0u, DE_NULL, 1u, &outputBufferPreHostReadBarrier, 0u, DE_NULL);

	endCommandBuffer(deviceInterface, *cmdBuffer);

	submitCommandsAndWait(deviceInterface, device, queue, *cmdBuffer);

	Allocation& outputBufferAllocation = m_outputBuffer->getAllocation();

	invalidateMappedMemoryRange(deviceInterface, device, outputBufferAllocation.getMemory(), outputBufferAllocation.getOffset(), outBuffSizeInBytes);

	if (verifyResult(outputBufferAllocation))
		return tcu::TestStatus::pass("Comparison succeeded");
	else
		return tcu::TestStatus::fail("Comparison failed");
}